

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O2

RealType __thiscall
OpenMD::EAM::getSuggestedCutoffRadius(EAM *this,pair<OpenMD::AtomType_*,_OpenMD::AtomType_*> atypes)

{
  pointer piVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  EAMAtomData data1;
  double local_98;
  EAMAtomData local_90;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  iVar2 = AtomType::getIdent(atypes.first);
  iVar3 = AtomType::getIdent(atypes.second);
  piVar1 = (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)piVar1[iVar2];
  iVar2 = piVar1[iVar3];
  if (lVar4 == -1) {
    local_98 = 0.0;
  }
  else {
    EAMAtomData::EAMAtomData
              (&local_90,
               (this->EAMdata).
               super__Vector_base<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>._M_impl
               .super__Vector_impl_data._M_start + lVar4);
    local_98 = local_90.rcut;
    EAMAtomData::~EAMAtomData(&local_90);
  }
  if (iVar2 != -1) {
    EAMAtomData::EAMAtomData
              (&local_90,
               (this->EAMdata).
               super__Vector_base<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>._M_impl
               .super__Vector_impl_data._M_start + iVar2);
    if (local_90.rcut <= local_98) {
      local_90.rcut = local_98;
    }
    EAMAtomData::~EAMAtomData(&local_90);
    local_98 = local_90.rcut;
  }
  return local_98;
}

Assistant:

RealType EAM::getSuggestedCutoffRadius(pair<AtomType*, AtomType*> atypes) {
    if (!initialized_) initialize();

    RealType cut = 0.0;

    int atid1   = atypes.first->getIdent();
    int atid2   = atypes.second->getIdent();
    int eamtid1 = EAMtids[atid1];
    int eamtid2 = EAMtids[atid2];

    if (eamtid1 != -1) {
      EAMAtomData data1 = EAMdata[eamtid1];
      cut               = data1.rcut;
    }

    if (eamtid2 != -1) {
      EAMAtomData data2 = EAMdata[eamtid2];
      if (data2.rcut > cut) cut = data2.rcut;
    }

    return cut;
  }